

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

void SimpleString::padStringsToSameLength(SimpleString *str1,SimpleString *str2,char padCharacter)

{
  size_t sVar1;
  size_t sVar2;
  SimpleString *this;
  SimpleString SStack_38;
  char local_2a [2];
  SimpleString local_28;
  
  do {
    this = str1;
    str1 = str2;
    sVar1 = size(this);
    sVar2 = size(str1);
    str2 = this;
  } while (sVar2 < sVar1);
  local_2a[1] = 0;
  local_2a[0] = padCharacter;
  SimpleString(&local_28,local_2a,sVar2 - sVar1);
  operator+(&SStack_38,&local_28);
  operator=(this,&SStack_38);
  ~SimpleString(&SStack_38);
  ~SimpleString(&local_28);
  return;
}

Assistant:

void SimpleString::padStringsToSameLength(SimpleString& str1, SimpleString& str2, char padCharacter)
{
    if (str1.size() > str2.size()) {
        padStringsToSameLength(str2, str1, padCharacter);
        return;
    }

    char pad[2];
    pad[0] = padCharacter;
    pad[1] = 0;
    str1 = SimpleString(pad, str2.size() - str1.size()) + str1;
}